

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ds_list.c
# Opt level: O1

DS_STATUS ds_list_insert(DsList *list,int index,void *data)

{
  ulong uVar1;
  DsListEntry *pDVar2;
  DsListEntry *entry;
  DsListEntry *pDVar3;
  DsListEntry *pDVar4;
  DsList *pDVar5;
  ulong uVar6;
  int iVar7;
  DsList *pDVar8;
  bool bVar9;
  
  if (list == (DsList *)0x0) {
    return DS_STATUS_NULL;
  }
  uVar6 = (ulong)(uint)index;
  if (index < 0) {
    return DS_STATUS_OUTMEM;
  }
  uVar1 = list->size;
  if (uVar1 < uVar6) {
    return DS_STATUS_OUTMEM;
  }
  pDVar2 = (DsListEntry *)malloc(0x18);
  if (pDVar2 == (DsListEntry *)0x0) {
    return DS_STATUS_OUTMEM;
  }
  pDVar2->data = data;
  pDVar2->next = (DsListEntry *)0x0;
  pDVar2->prev = (DsListEntry *)0x0;
  pDVar3 = list->entry;
  bVar9 = pDVar3 == (DsListEntry *)0x0;
  pDVar5 = list;
  if ((!bVar9) && (index != 0 && pDVar3->next != (DsListEntry *)0x0)) {
    while( true ) {
      pDVar5 = (DsList *)&pDVar3->next;
      pDVar3 = *(DsListEntry **)pDVar5;
      bVar9 = pDVar3 == (DsListEntry *)0x0;
      iVar7 = (int)uVar6;
      if (bVar9) break;
      if ((pDVar3->next == (DsListEntry *)0x0) || (uVar6 = (ulong)(iVar7 - 1), iVar7 < 2)) break;
    }
    index = iVar7 - 1;
  }
  if (uVar1 == (uint)index) {
    if (!bVar9) {
      do {
        pDVar4 = pDVar3;
        pDVar3 = pDVar4->next;
      } while (pDVar4->next != (DsListEntry *)0x0);
      pDVar4->next = pDVar2;
      pDVar2->next = (DsListEntry *)0x0;
      pDVar2->prev = pDVar4;
      goto LAB_00101286;
    }
  }
  else if (!bVar9) {
    pDVar2->next = pDVar3;
    pDVar2->prev = pDVar3->prev;
    pDVar8 = (DsList *)&pDVar3->prev->next;
    if (pDVar3->prev == (DsListEntry *)0x0) {
      pDVar8 = pDVar5;
    }
    pDVar8->entry = pDVar2;
    pDVar3->prev = pDVar2;
    goto LAB_00101286;
  }
  pDVar5->entry = pDVar2;
LAB_00101286:
  list->size = uVar1 + 1;
  return DS_STATUS_OK;
}

Assistant:

DS_STATUS ds_list_insert(DsList *list, int index, void *data)
{
    if (NULL == list)
        return DS_STATUS_NULL;
    if (index < 0 || index > list->size)
        return DS_STATUS_OUTMEM;

    DsListEntry *in = (DsListEntry *)malloc(sizeof(DsListEntry));
    if (NULL == in)
        return DS_STATUS_OUTMEM;
    in->data = data;
    in->next = NULL;
    in->prev = NULL;

    DS_STATUS status;

    // ! 这里需要获取list->entry的地址
    DsListEntry **entry = &list->entry;
    while ((*entry) && (*entry)->next && index > 0)
    {
        index--;
        // ! 需要改变的是entry的地址
        entry = &(*entry)->next;
    }

    if (index == list->size)
        status = ds_entry_append(entry, in);
    else
        status = ds_entry_prepend(entry, in);

    if (status != DS_STATUS_OK)
    {
        free(in);
        return DS_STATUS_NULL;
    }

    (list->size)++;
    return DS_STATUS_OK;
}